

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

bool __thiscall CLI::App::_valid_subcommand(App *this,string *current)

{
  pointer puVar1;
  App *this_00;
  bool bVar2;
  pointer puVar3;
  string local_50;
  
  while ((this->require_subcommand_max_ != 0 &&
         (this->require_subcommand_max_ <=
          (ulong)((long)(this->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)))) {
    this = this->parent_;
    if (this == (App *)0x0) {
      return false;
    }
  }
  puVar1 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->subcommands_).
                super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    this_00 = (puVar3->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
              super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
              super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_50,(string *)current);
    bVar2 = check_name(this_00,&local_50);
    if (bVar2) {
      bVar2 = ((puVar3->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->parsed_;
      ::std::__cxx11::string::~string((string *)&local_50);
      if (bVar2 == false) {
        return true;
      }
    }
    else {
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if (this->parent_ == (App *)0x0) {
    return false;
  }
  bVar2 = _valid_subcommand(this->parent_,current);
  return bVar2;
}

Assistant:

bool _valid_subcommand(const std::string &current) const {
        // Don't match if max has been reached - but still check parents
        if(require_subcommand_max_ != 0 && parsed_subcommands_.size() >= require_subcommand_max_) {
            return parent_ != nullptr && parent_->_valid_subcommand(current);
        }

        for(const App_p &com : subcommands_)
            if(com->check_name(current) && !*com)
                return true;

        // Check parent if exists, else return false
        return parent_ != nullptr && parent_->_valid_subcommand(current);
    }